

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O1

void __thiscall
JsonNumber_IntegerPositiveOverflow_Test::TestBody(JsonNumber_IntegerPositiveOverflow_Test *this)

{
  error_category *peVar1;
  parser<callbacks_proxy<mock_json_callbacks>_> *this_00;
  char *message;
  AssertionResult gtest_ar;
  parser<callbacks_proxy<mock_json_callbacks>_> p;
  AssertHelper local_f0;
  error_category *local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  long local_d8 [2];
  error_code local_c8;
  parser<callbacks_proxy<mock_json_callbacks>_> local_b8;
  
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::parser
            (&local_b8,(this->super_JsonNumber).proxy_.original_,none);
  local_e8 = (error_category *)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"18446744073709551616","");
  peVar1 = local_e8;
  pstore::gsl::details::extent_type<-1L>::extent_type
            ((extent_type<_1L> *)&local_c8,(index_type)local_e0);
  local_c8._M_cat = peVar1;
  this_00 = pstore::json::parser<callbacks_proxy<mock_json_callbacks>>::
            input<pstore::gsl::span<char_const,_1l>>
                      ((parser<callbacks_proxy<mock_json_callbacks>> *)&local_b8,
                       (span<const_char,__1L> *)&local_c8);
  pstore::json::parser<callbacks_proxy<mock_json_callbacks>_>::eof(this_00);
  if (local_e8 != (error_category *)local_d8) {
    operator_delete(local_e8,local_d8[0] + 1);
  }
  local_c8._M_cat = pstore::json::get_error_category();
  local_c8._M_value = 6;
  testing::internal::CmpHelperEQ<std::error_code,std::error_code>
            ((internal *)&local_e8,"p.last_error ()",
             "make_error_code (json::error_code::number_out_of_range)",&local_b8.error_,&local_c8);
  if (local_e8._0_1_ == (string)0x0) {
    testing::Message::Message((Message *)&local_c8);
    if (local_e0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_e0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/json/test_number.cpp"
               ,0xe3,message);
    testing::internal::AssertHelper::operator=(&local_f0,(Message *)&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_f0);
    if ((long *)local_c8._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_c8._0_8_ + 8))();
    }
  }
  if (local_e0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_e0,local_e0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8.string_._M_dataplus._M_p != &local_b8.string_.field_2) {
    operator_delete(local_b8.string_._M_dataplus._M_p,
                    local_b8.string_.field_2._M_allocated_capacity + 1);
  }
  std::
  deque<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>,_pstore::json::details::deleter<pstore::json::details::matcher<callbacks_proxy<mock_json_callbacks>_>_>_>_>_>
  ::~deque(&local_b8.stack_.c);
  if ((_Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
       )local_b8.singletons_._M_t.
        super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
        .
        super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
        ._M_head_impl != (singleton_storage<callbacks_proxy<mock_json_callbacks>_> *)0x0) {
    operator_delete((void *)local_b8.singletons_._M_t.
                            super___uniq_ptr_impl<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_std::default_delete<pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_>_>
                            .
                            super__Head_base<0UL,_pstore::json::details::singleton_storage<callbacks_proxy<mock_json_callbacks>_>_*,_false>
                            ._M_head_impl,0x68);
  }
  return;
}

Assistant:

TEST_F (JsonNumber, IntegerPositiveOverflow) {
    json::parser<decltype (proxy_)> p (proxy_);
    p.input (std::string{uint64_overflow}).eof ();
    EXPECT_EQ (p.last_error (), make_error_code (json::error_code::number_out_of_range));
}